

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall
FIX::Message::Message
          (Message *this,message_order *headerOrder,message_order *trailerOrder,message_order *order
          )

{
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001f92d0;
  FieldMap::FieldMap(&(this->m_header).super_FieldMap,headerOrder);
  (this->m_header).super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f9308;
  FieldMap::FieldMap(&(this->m_trailer).super_FieldMap,trailerOrder);
  (this->m_trailer).super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f9340;
  this->m_validStructure = true;
  return;
}

Assistant:

Message::Message(const message_order &headerOrder, const message_order &trailerOrder, const message_order &order)
    : FieldMap(order),
      m_header(headerOrder),
      m_trailer(trailerOrder),
      m_validStructure(true) {}